

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_delete(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ushort uVar1;
  ushort *puVar2;
  undefined4 *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ion_bpp_err_t iVar7;
  uint uVar8;
  ion_bpp_node_t *piVar9;
  ulong uVar10;
  ion_bpp_h_node_t *h;
  int iVar11;
  ion_bpp_address_t adr;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *piVar12;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_key_t *mkey;
  uint local_74;
  void *local_70;
  ion_bpp_address_t local_68;
  ion_bpp_buffer_t *local_60;
  ion_bpp_buffer_t *tmp [4];
  
  local_60 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  bVar4 = false;
  bVar5 = false;
  buf = local_60;
  local_70 = key;
LAB_0010a646:
  do {
    if ((undefined1  [40])((undefined1  [40])*buf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      iVar7 = bErrKeyNotFound;
      iVar6 = search(handle,buf,local_70,*rec,&mkey,MODE_MATCH);
      if (iVar6 == 0) {
        *rec = *(ion_bpp_external_address_t *)(mkey + *(int *)((long)handle + 8));
        piVar9 = buf->p;
        iVar11 = ((int)mkey - (int)piVar9) + -0x20;
        uVar1 = *(ushort *)piVar9;
        iVar6 = *(int *)((long)handle + 0xbc) * ((uVar1 >> 1) - 1) - iVar11;
        if (iVar6 != 0) {
          memmove(mkey,mkey + *(int *)((long)handle + 0xbc),(long)iVar6);
          piVar9 = buf->p;
          uVar1 = *(ushort *)piVar9;
        }
        *(ushort *)piVar9 = uVar1 - 2;
        buf->valid = boolean_true;
        buf->modified = boolean_true;
        if ((iVar11 == 0) && (bVar5)) {
          iVar7 = readDisk(handle,local_68,&cbuf);
          if (iVar7 != bErrOk) {
            return iVar7;
          }
          piVar9 = cbuf->p;
          uVar10 = (ulong)local_74;
          memcpy(&piVar9->fkey + uVar10,mkey,(long)*(int *)((long)handle + 8));
          *(undefined8 *)(&piVar9->fkey + (long)*(int *)((long)handle + 8) + uVar10) =
               *(undefined8 *)(mkey + *(int *)((long)handle + 8));
          cbuf->valid = boolean_true;
          cbuf->modified = boolean_true;
        }
        nKeysDel = nKeysDel + 1;
        iVar7 = bErrOk;
      }
      return iVar7;
    }
    iVar6 = search(handle,buf,local_70,*rec,&mkey,MODE_MATCH);
    piVar12 = mkey;
    if (iVar6 < 0) {
      adr = *(ion_bpp_address_t *)(mkey + -8);
    }
    else {
      adr = *(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar7 = readDisk(handle,adr,&cbuf);
    if (iVar7 != bErrOk) {
      return iVar7;
    }
    if (*(uint *)((long)handle + 0xb8) >> 1 == (uint)(*(ushort *)cbuf->p >> 1)) {
      iVar7 = gather(handle,buf,&mkey,tmp);
      if (iVar7 != bErrOk) {
        return iVar7;
      }
      if ((buf == local_60) && ((**(ushort **)((long)handle + 0x38) & 0xfffe) == 4)) {
        uVar8 = (uint)(**(ushort **)((long)handle + 0x98) >> 1);
        if (uVar8 < (uint)(*(int *)((long)handle + 0xb8) * 9) >> 2) {
          memcpy(*(ushort **)((long)handle + 0x38) + 0x10,*(ushort **)((long)handle + 0x98) + 0x10,
                 (ulong)uVar8 * (long)*(int *)((long)handle + 0xbc));
          puVar2 = *(ushort **)((long)handle + 0x38);
          puVar3 = *(undefined4 **)((long)handle + 0x98);
          *(undefined8 *)(puVar2 + 0xc) = *(undefined8 *)(puVar3 + 6);
          *puVar2 = *puVar2 & 1 | (ushort)*puVar3 & 0xfffe;
          **(ushort **)((long)handle + 0x38) =
               (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x38) & 0xfffe |
               **(ushort **)((long)handle + 0x98) & 1;
          nNodesDel = nNodesDel + 3;
          goto LAB_0010a646;
        }
      }
      iVar7 = scatter(handle,buf,mkey,3,tmp);
      if (iVar7 != bErrOk) {
        return iVar7;
      }
      iVar6 = search(handle,buf,local_70,*rec,&mkey,MODE_MATCH);
      piVar12 = mkey;
      if (iVar6 < 0) {
        iVar7 = readDisk(handle,*(ion_bpp_address_t *)(mkey + -8),&cbuf);
        if (iVar7 != bErrOk) {
          return iVar7;
        }
        goto LAB_0010a81f;
      }
      iVar7 = readDisk(handle,*(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8),
                       &cbuf);
      if (iVar7 != bErrOk) {
        return iVar7;
      }
LAB_0010a7f5:
      local_68 = buf->adr;
      iVar6 = (int)piVar12 - *(int *)&buf->p;
    }
    else {
      if (-1 < iVar6) goto LAB_0010a7f5;
LAB_0010a81f:
      if (piVar12 == &buf->p->fkey) {
        buf = cbuf;
        if (bVar4) {
          bVar5 = true;
        }
        goto LAB_0010a646;
      }
      local_68 = buf->adr;
      iVar6 = ((int)piVar12 - *(int *)&buf->p) - *(int *)((long)handle + 0xbc);
    }
    local_74 = iVar6 - 0x20;
    bVar5 = false;
    bVar4 = true;
    buf = cbuf;
  } while( true );
}

Assistant:

ion_bpp_err_t
b_delete(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	ion_bpp_buffer_t	*root;
	ion_bpp_buffer_t	*gbuf;

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	gbuf		= &h->gbuf;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	buf			= root;

	while (1) {
		if (leaf(buf)) {
			/* set mkey to point to deletion point */
			if (search(handle, buf, key, *rec, &mkey, MODE_MATCH) == 0) {
				*rec = rec(mkey);
			}
			else {
				return bErrKeyNotFound;
			}

			/* shift items GT key to left */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf) - 1) - keyOff;

			if (len) {
				memmove(mkey, mkey + ks(1), len);
			}

			ct(buf)--;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if deleted key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				tkey		= fkey(tbuf) + lastGEkey;
				memcpy(key(tkey), mkey, h->keySize);
				rec(tkey)	= rec(mkey);

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysDel++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			/* read child */
			if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room to delete */
			if (ct(cbuf) == h->maxCt / 2) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				/* if last 3 bufs in root, and count is low enough... */
				if ((buf == root) && (ct(root) == 2) && (ct(gbuf) < (3 * (3 * h->maxCt)) / 4)) {
					/* collapse tree by one level */
					scatterRoot(handle);
					nNodesDel += 3;
					continue;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, *rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}